

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char cVar2;
  byte bVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  _func_int **__first;
  undefined8 uVar6;
  uint uVar7;
  char cVar8;
  uint uVar9;
  char *pcVar10;
  buffer_appender<char> bVar11;
  char *pcVar12;
  buffer<char> *buf;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 local_2b0 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  string groups;
  
  grouping_impl<char>((string *)(digits + 0x20),(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
    goto LAB_00233067;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_00233067;
  }
  puVar1 = &this->abs_value;
  uVar21 = (ulong)*puVar1;
  uVar22 = *(ulong *)((long)&this->abs_value + 8);
  auVar5 = (undefined1  [16])*puVar1;
  auVar28 = (undefined1  [16])*puVar1;
  uVar24 = 1;
  groups.field_2._8_8_ = this;
  if ((uVar21 < 10) <= uVar22) {
    uVar7 = 4;
    auVar27 = auVar28;
    do {
      uVar24 = uVar7;
      uVar26 = auVar27._8_8_;
      uVar13 = auVar27._0_8_;
      if (uVar26 == 0 && (ulong)(99 < uVar13) <= -uVar26) {
        uVar24 = uVar24 - 2;
        goto LAB_00232cfe;
      }
      if (uVar26 == 0 && (ulong)(999 < uVar13) <= -uVar26) {
        uVar24 = uVar24 - 1;
        goto LAB_00232cfe;
      }
      if (uVar26 < (uVar13 < 10000)) goto LAB_00232cfe;
      auVar27 = __udivti3(uVar13,uVar26,10000,0);
      uVar7 = uVar24 + 4;
    } while (uVar26 != 0 || -uVar26 < (ulong)(99999 < uVar13));
    uVar24 = uVar24 + 1;
  }
LAB_00232cfe:
  pcVar12 = (char *)digits._32_8_;
  uVar20 = uVar24;
  uVar7 = uVar24;
  if (groups._M_dataplus._M_p == (pointer)0x0) {
LAB_00232d45:
    uVar9 = uVar7;
    uVar19 = uVar20;
    if (pcVar12 == groups._M_dataplus._M_p + digits._32_8_) goto LAB_00232d50;
  }
  else {
    uVar19 = uVar24 + (int)groups._M_dataplus._M_p;
    _Var16._M_p = groups._M_dataplus._M_p;
    do {
      cVar2 = *pcVar12;
      uVar9 = uVar7 - (int)cVar2;
      if ((uVar9 == 0 || (int)uVar7 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00232d45;
      uVar20 = uVar20 + 1;
      pcVar12 = pcVar12 + 1;
      _Var16._M_p = _Var16._M_p + -1;
      uVar7 = uVar9;
    } while (_Var16._M_p != (pointer)0x0);
LAB_00232d50:
    uVar19 = (int)(uVar9 - 1) / (int)(groups._M_dataplus._M_p + digits._32_8_)[-1] + uVar19;
  }
  iVar23 = 1;
  if ((uVar21 < 10) <= uVar22) {
    iVar25 = 4;
    auVar27 = auVar28;
    do {
      iVar23 = iVar25;
      uVar13 = auVar27._8_8_;
      uVar26 = auVar27._0_8_;
      if (uVar13 == 0 && (ulong)(99 < uVar26) <= -uVar13) {
        iVar23 = iVar23 + -2;
        goto LAB_00232dfb;
      }
      if (uVar13 == 0 && (ulong)(999 < uVar26) <= -uVar13) {
        iVar23 = iVar23 + -1;
        goto LAB_00232dfb;
      }
      if (uVar13 < (uVar26 < 10000)) goto LAB_00232dfb;
      auVar27 = __udivti3(uVar26,uVar13,10000,0);
      iVar25 = iVar23 + 4;
    } while (uVar13 != 0 || -uVar13 < (ulong)(99999 < uVar26));
    iVar23 = iVar23 + 1;
  }
LAB_00232dfb:
  if ((int)uVar24 < iVar23) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                ,0x39c,"invalid digit count");
  }
  pcVar12 = digits + (long)(int)uVar24 + -8;
  pcVar10 = pcVar12;
  if ((uVar21 < 100) <= uVar22) {
    do {
      lVar14 = auVar28._8_8_;
      uVar21 = auVar28._0_8_;
      pcVar12 = pcVar10 + -2;
      auVar28 = __udivti3(uVar21,lVar14,100,0);
      *(undefined2 *)(pcVar10 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar21 + auVar28._0_8_ * -100) * 2);
      pcVar10 = pcVar12;
      auVar5 = auVar28;
    } while (lVar14 != 0 || (ulong)-lVar14 < (ulong)(9999 < uVar21));
  }
  if (auVar5._8_8_ == 0 && (ulong)(9 < auVar5._0_8_) <= (ulong)-auVar5._8_8_) {
    pcVar12[-1] = auVar5[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar12 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar5._0_8_ * 2);
  }
  uVar6 = groups.field_2._8_8_;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  local_2b0 = (undefined1  [8])&PTR_grow_002b1bd8;
  buffer.super_buffer<char>.size_ = 500;
  uVar19 = uVar19 + *(int *)(groups.field_2._8_8_ + 0x34);
  if (-1 < (int)uVar19) {
    pcVar12 = (char *)(ulong)uVar19;
    if (500 < uVar19) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2b0,
                 (size_t)pcVar12);
    }
    __first = buffer.super_buffer<char>._vptr_buffer;
    buffer.super_buffer<char>.ptr_ = (char *)buffer.super_buffer<char>.size_;
    if (pcVar12 <= buffer.super_buffer<char>.size_) {
      buffer.super_buffer<char>.ptr_ = pcVar12;
    }
    iVar25 = uVar24 + 1;
    pcVar18 = digits + ((ulong)uVar24 - 9);
    iVar23 = 0;
    pcVar10 = (char *)((long)buffer.super_buffer<char>._vptr_buffer + (long)pcVar12);
    pcVar17 = (char *)digits._32_8_;
    do {
      pcVar15 = pcVar10 + -1;
      pcVar10[-1] = *pcVar18;
      cVar2 = *pcVar17;
      if ('\0' < cVar2) {
        iVar23 = iVar23 + 1;
        if ((cVar2 != '\x7f') && (iVar23 % (int)cVar2 == 0)) {
          pcVar15 = pcVar17 + 1;
          if (pcVar15 != groups._M_dataplus._M_p + digits._32_8_) {
            pcVar17 = pcVar15;
          }
          if (pcVar15 != groups._M_dataplus._M_p + digits._32_8_) {
            iVar23 = 0;
          }
          pcVar10[-2] = cVar8;
          pcVar15 = pcVar10 + -2;
        }
      }
      iVar25 = iVar25 + -1;
      pcVar18 = pcVar18 + -1;
      pcVar10 = pcVar15;
    } while (1 < iVar25);
    if (*(int *)(uVar6 + 0x34) != 0) {
      pcVar15[-1] = '-';
    }
    piVar4 = *(int **)(uVar6 + 0x10);
    pcVar10 = (char *)(long)*piVar4;
    if (-1 < (long)pcVar10) {
      uVar21 = 0;
      if (pcVar12 <= pcVar10) {
        uVar21 = (long)pcVar10 - (long)pcVar12;
      }
      bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)uVar6;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)(*(byte *)((long)piVar4 + 9) & 0xf));
      if (*(char **)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          pcVar12 + *(byte *)((long)piVar4 + 0xe) * uVar21 +
                    *(long *)((long)bVar11.
                                    super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10)) {
        (*(code *)**(undefined8 **)
                    bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar22 = uVar21 >> (bVar3 & 0x3f);
      bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar11,uVar22,(fill_t<char> *)((long)piVar4 + 10));
      bVar11 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         ((char *)__first,pcVar12 + (long)__first,bVar11);
      bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar11,uVar21 - uVar22,(fill_t<char> *)((long)piVar4 + 10));
      *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)groups.field_2._8_8_ =
           bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_2b0 = (undefined1  [8])&PTR_grow_002b1bd8;
      if (buffer.super_buffer<char>._vptr_buffer !=
          (_func_int **)&buffer.super_buffer<char>.capacity_) {
        operator_delete(buffer.super_buffer<char>._vptr_buffer,buffer.super_buffer<char>.size_);
      }
LAB_00233067:
      if ((size_type *)digits._32_8_ != &groups._M_string_length) {
        operator_delete((void *)digits._32_8_,groups._M_string_length + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
              ,0x13c,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }